

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

void strings_equal<char>(string *n_s,string *n_p,int n,string *iexpected,locale *l,string *domain)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  runtime_error *this;
  int iVar7;
  locale *in_R8;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss_2;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss_1;
  locale tmp_locale;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  string_type tmp;
  locale tmp_locale_1;
  char *p_c_str;
  char *s_c_str;
  string_type p;
  string_type s;
  string_type expected;
  undefined4 in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff0fc;
  basic_message<char> *in_stack_fffffffffffff100;
  basic_message<char> *in_stack_fffffffffffff108;
  string *s_00;
  runtime_error *in_stack_fffffffffffff110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff120;
  undefined7 in_stack_fffffffffffff128;
  undefined1 in_stack_fffffffffffff12f;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffff130;
  string *in_stack_fffffffffffff140;
  basic_message<char> *in_stack_fffffffffffff148;
  allocator *paVar8;
  undefined1 local_cf9 [33];
  string local_cd8 [48];
  string *in_stack_fffffffffffff358;
  locale local_c18;
  ostringstream local_c10 [382];
  undefined1 local_a92;
  allocator local_a91;
  string local_a90 [32];
  string local_a70 [192];
  locale local_9b0;
  ostringstream local_9a8 [376];
  locale local_830;
  undefined1 local_822;
  allocator local_821;
  string local_820 [160];
  string local_780 [32];
  locale local_760;
  locale local_758;
  undefined1 local_74a;
  allocator local_749;
  string local_748 [160];
  string local_6a8 [38];
  undefined1 local_682;
  allocator local_681;
  string local_680 [32];
  string local_660 [160];
  locale local_5c0;
  ostringstream local_5b8 [376];
  locale local_440;
  undefined1 local_432;
  allocator local_431;
  string local_430 [160];
  string local_390 [38];
  undefined1 local_36a;
  allocator local_369;
  string local_368 [160];
  string local_2c8 [32];
  locale local_2a8;
  locale local_2a0;
  undefined1 local_292;
  allocator local_291;
  string local_290 [160];
  string local_1f0 [32];
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [160];
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [48];
  locale local_58;
  string local_50 [80];
  
  std::locale::locale(&local_58,in_R8);
  to_correct_string<char>((string *)in_stack_fffffffffffff108,(locale *)in_stack_fffffffffffff100);
  std::locale::~locale(&local_58);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,pcVar4,&local_a9);
  to<char>(in_stack_fffffffffffff358);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,pcVar4,&local_f1);
  to<char>(in_stack_fffffffffffff358);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff100,
                          (char *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
  if (bVar1) {
    test_counter = test_counter + 1;
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
    booster::locale::basic_message<char>::str_abi_cxx11_
              (in_stack_fffffffffffff108,(locale *)in_stack_fffffffffffff100);
    _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_118);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7d);
      poVar5 = std::operator<<(poVar5," bl::translate(s,p,n).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_1ba = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1b8,"Error limits reached, stopping unit test",&local_1b9);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
        local_1ba = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    local_1c8 = std::__cxx11::string::c_str();
    local_1d0 = std::__cxx11::string::c_str();
    test_counter = test_counter + 1;
    booster::locale::translate<char>
              ((char *)in_stack_fffffffffffff108,(char *)in_stack_fffffffffffff100,
               in_stack_fffffffffffff0fc);
    booster::locale::basic_message<char>::str_abi_cxx11_
              (in_stack_fffffffffffff108,(locale *)in_stack_fffffffffffff100);
    _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_1f0);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x7f);
      poVar5 = std::operator<<(poVar5," bl::translate(s_c_str,p_c_str,n).str(l)==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_292 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_290,"Error limits reached, stopping unit test",&local_291);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
        local_292 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::locale(&local_2a0);
    std::locale::global(&local_2a8);
    std::locale::~locale(&local_2a8);
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
    booster::locale::basic_message::operator_cast_to_string
              ((basic_message<char> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
    ;
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x83);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_36a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_368,"Error limits reached, stopping unit test",&local_369);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
        local_36a = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
    booster::locale::basic_message<char>::str_abi_cxx11_
              ((basic_message<char> *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128))
    ;
    std::__cxx11::string::operator=(local_2c8,local_390);
    std::__cxx11::string::~string(local_390);
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
    test_counter = test_counter + 1;
    _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x85);
      poVar5 = std::operator<<(poVar5," tmp==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_432 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_430,"Error limits reached, stopping unit test",&local_431);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
        local_432 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::locale::global(&local_440);
    std::locale::~locale(&local_440);
    std::__cxx11::ostringstream::ostringstream(local_5b8);
    std::ios::imbue(&local_5c0);
    std::locale::~locale(&local_5c0);
    booster::locale::translate<char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
    booster::locale::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff100,
               (basic_message<char> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
    ;
    booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
    test_counter = test_counter + 1;
    std::__cxx11::ostringstream::str();
    _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
    std::__cxx11::string::~string(local_660);
    if (!_Var2) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8b);
      poVar5 = std::operator<<(poVar5," ss.str()==expected");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      iVar7 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar7;
      if (bVar1) {
        local_682 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_680,"Error limits reached, stopping unit test",&local_681);
        booster::runtime_error::runtime_error
                  (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
        local_682 = 0;
        __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_5b8);
    std::__cxx11::string::~string(local_2c8);
    std::locale::~locale(&local_2a0);
  }
  test_counter = test_counter + 1;
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
  booster::locale::basic_message<char>::str
            ((basic_message<char> *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128),
             (locale *)in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::__cxx11::string::~string(local_6a8);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x8d);
    poVar5 = std::operator<<(poVar5," bl::translate(s,p,n).str(l,domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_74a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_748,"Error limits reached, stopping unit test",&local_749);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
      local_74a = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_758);
  std::locale::global(&local_760);
  std::locale::~locale(&local_760);
  test_counter = test_counter + 1;
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
  booster::locale::basic_message<char>::str(in_stack_fffffffffffff148,in_stack_fffffffffffff140);
  _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::__cxx11::string::~string(local_780);
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x90);
    poVar5 = std::operator<<(poVar5," bl::translate(s,p,n).str(domain)==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_822 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_820,"Error limits reached, stopping unit test",&local_821);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
      local_822 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_830);
  std::locale::~locale(&local_830);
  std::__cxx11::ostringstream::ostringstream(local_9a8);
  std::ios::imbue(&local_9b0);
  std::locale::~locale(&local_9b0);
  booster::locale::as::domain((string *)in_stack_fffffffffffff108);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff130,
             (set_domain *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128));
  booster::locale::translate<char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
  booster::locale::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff100,
             (basic_message<char> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x11f45c);
  test_counter = test_counter + 1;
  std::__cxx11::ostringstream::str();
  _Var2 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::__cxx11::string::~string(local_a70);
  if (!_Var2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x96);
    poVar5 = std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      local_a92 = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      paVar8 = &local_a91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a90,"Error limits reached, stopping unit test",paVar8);
      booster::runtime_error::runtime_error
                (in_stack_fffffffffffff110,(string *)in_stack_fffffffffffff108);
      local_a92 = 0;
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_9a8);
  std::__cxx11::ostringstream::ostringstream(local_c10);
  std::ios::imbue(&local_c18);
  std::locale::~locale(&local_c18);
  booster::locale::as::domain((string *)in_stack_fffffffffffff108);
  booster::locale::as::details::operator<<
            (in_stack_fffffffffffff130,
             (set_domain *)CONCAT17(in_stack_fffffffffffff12f,in_stack_fffffffffffff128));
  std::__cxx11::string::c_str();
  std::__cxx11::string::c_str();
  booster::locale::translate<char>
            ((char *)in_stack_fffffffffffff108,(char *)in_stack_fffffffffffff100,
             in_stack_fffffffffffff0fc);
  booster::locale::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff100,
             (basic_message<char> *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
  booster::locale::basic_message<char>::~basic_message(in_stack_fffffffffffff100);
  booster::locale::as::details::set_domain::~set_domain((set_domain *)0x11f765);
  test_counter = test_counter + 1;
  std::__cxx11::ostringstream::str();
  bVar3 = std::operator==(in_stack_fffffffffffff120,in_stack_fffffffffffff118);
  std::__cxx11::string::~string(local_cd8);
  if ((bVar3 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x9c);
    this = (runtime_error *)std::operator<<(poVar5," ss.str()==expected");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    iVar7 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar7;
    if (bVar1) {
      uVar6 = __cxa_allocate_exception(0x30);
      s_00 = (string *)local_cf9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_cf9 + 1),"Error limits reached, stopping unit test",
                 (allocator *)s_00);
      booster::runtime_error::runtime_error(this,s_00);
      __cxa_throw(uVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_c10);
  std::locale::~locale(&local_758);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void strings_equal(std::string n_s,std::string n_p,int n,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type s = to<Char>(n_s.c_str());
    string_type p = to<Char>(n_p.c_str());
    if(domain=="default") {
        TEST(bl::translate(s,p,n).str(l)==expected);
        Char const *s_c_str=s.c_str(), *p_c_str=p.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(s_c_str,p_c_str,n).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(s,p,n);
        TEST(tmp==expected);
        tmp=bl::translate(s,p,n).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(s,p,n).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(s,p,n).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s.c_str(),p.c_str(),n);
        TEST(ss.str()==expected);
    }
}